

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O1

VRDatumPtr * __thiscall MinVR::VRDatumPtr::operator=(VRDatumPtr *this,VRDatumPtr *sp)

{
  VRDatumPtrRC *pVVar1;
  
  if (this != sp) {
    pVVar1 = this->reference;
    pVVar1->count = pVVar1->count + -1;
    if (pVVar1->count == 0) {
      if (this->pData != (VRDatum_conflict *)0x0) {
        (*this->pData->_vptr_VRDatum[1])();
      }
      if (this->reference != (VRDatumPtrRC *)0x0) {
        operator_delete(this->reference,4);
      }
    }
    this->pData = sp->pData;
    pVVar1 = sp->reference;
    this->reference = pVVar1;
    pVVar1->count = pVVar1->count + 1;
  }
  return this;
}

Assistant:

VRDatumPtr& operator = (const VRDatumPtr& sp)
  {
    // Assignment operator
    if (this != &sp) // Avoid self assignment
      {
        // Decrement the old reference count.  If references become
        // zero, delete the data.
        if(reference->release() == 0)
          {
            delete pData;
            delete reference;
          }

        // Copy the data and reference pointer and increment the
        // reference count
        pData = sp.pData;
        reference = sp.reference;
        reference->addRef();
      }
    return *this;
  }